

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int h2_client_new(Curl_cfilter *cf,nghttp2_session_callbacks *cbs)

{
  int iVar1;
  nghttp2_option *pnStack_30;
  int rc;
  nghttp2_option *o;
  cf_h2_ctx *ctx;
  nghttp2_session_callbacks *cbs_local;
  Curl_cfilter *cf_local;
  
  o = (nghttp2_option *)cf->ctx;
  ctx = (cf_h2_ctx *)cbs;
  cbs_local = (nghttp2_session_callbacks *)cf;
  cf_local._4_4_ = nghttp2_option_new(&stack0xffffffffffffffd0);
  if (cf_local._4_4_ == 0) {
    nghttp2_option_set_no_auto_window_update(pnStack_30,1);
    nghttp2_option_set_no_rfc9113_leading_and_trailing_ws_validation(pnStack_30,1);
    iVar1 = nghttp2_session_client_new2
                      ((nghttp2_session **)o,(nghttp2_session_callbacks *)ctx,cbs_local,pnStack_30);
    nghttp2_option_del(pnStack_30);
    cf_local._4_4_ = iVar1;
  }
  return cf_local._4_4_;
}

Assistant:

static int h2_client_new(struct Curl_cfilter *cf,
                         nghttp2_session_callbacks *cbs)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  nghttp2_option *o;

  int rc = nghttp2_option_new(&o);
  if(rc)
    return rc;
  /* We handle window updates ourself to enforce buffer limits */
  nghttp2_option_set_no_auto_window_update(o, 1);
#if NGHTTP2_VERSION_NUM >= 0x013200
  /* with 1.50.0 */
  /* turn off RFC 9113 leading and trailing white spaces validation against
     HTTP field value. */
  nghttp2_option_set_no_rfc9113_leading_and_trailing_ws_validation(o, 1);
#endif
  rc = nghttp2_session_client_new2(&ctx->h2, cbs, cf, o);
  nghttp2_option_del(o);
  return rc;
}